

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.cpp
# Opt level: O0

bool __thiscall
libchars::command_cursor::find(command_cursor *this,string *search,filter_t mask,bool ignore_hidden)

{
  char cVar1;
  char cVar2;
  ulong uVar3;
  command_node *pcVar4;
  ulong uVar5;
  char *pcVar6;
  size_t sVar7;
  reference ppcVar8;
  bool bVar9;
  byte local_79;
  byte local_6d;
  command_node *local_48;
  command_node *n;
  ulong uStack_38;
  char c;
  size_t si;
  filter_t fStack_28;
  bool ignore_hidden_local;
  filter_t mask_local;
  string *search_local;
  command_cursor *this_local;
  
  si._7_1_ = ignore_hidden;
  fStack_28 = mask;
  mask_local = (filter_t)search;
  search_local = (string *)this;
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    uStack_38 = 0;
    while( true ) {
      while( true ) {
        while( true ) {
          pcVar4 = current(this);
          uVar3 = uStack_38;
          bVar9 = false;
          if (pcVar4 != (command_node *)0x0) {
            uVar5 = std::__cxx11::string::length();
            bVar9 = uVar3 < uVar5;
          }
          if (!bVar9) {
            pcVar4 = current(this);
            uVar3 = uStack_38;
            local_6d = 0;
            if (pcVar4 != (command_node *)0x0) {
              uVar5 = std::__cxx11::string::length();
              local_6d = 0;
              if (uVar5 <= uVar3) {
                pcVar4 = current(this);
                local_6d = 0;
                if ((pcVar4->mask & fStack_28) != 0) {
                  pcVar4 = current(this);
                  local_79 = 1;
                  if ((pcVar4->hidden & 1U) != 0) {
                    local_79 = si._7_1_;
                  }
                  local_6d = local_79;
                }
              }
            }
            return (bool)(local_6d & 1);
          }
          pcVar6 = (char *)std::__cxx11::string::at(mask_local);
          n._7_1_ = *pcVar6;
          uVar3 = this->idx;
          sVar7 = current_length(this);
          cVar1 = n._7_1_;
          if (uVar3 < sVar7) break;
          pcVar4 = current(this);
          if (((pcVar4->head == (command_node *)0x0) ||
              (pcVar4 = current(this), (pcVar4->mask & fStack_28) == 0)) ||
             ((pcVar4 = current(this), (pcVar4->hidden & 1U) != 0 && ((si._7_1_ & 1) == 0)))) {
            return false;
          }
          pcVar4 = current(this);
          std::
          stack<libchars::command_node_*,_std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>_>
          ::push(&this->S,&pcVar4->head);
          this->idx = 0;
        }
        cVar2 = current_char(this);
        if (((cVar1 != cVar2) || (pcVar4 = current(this), (pcVar4->mask & fStack_28) == 0)) ||
           ((pcVar4 = current(this), (pcVar4->hidden & 1U) != 0 && ((si._7_1_ & 1) == 0)))) break;
        uStack_38 = uStack_38 + 1;
        this->idx = this->idx + 1;
        std::__cxx11::string::operator+=((string *)&this->w,n._7_1_);
      }
      if (this->idx != 0) {
        return false;
      }
      bVar9 = std::
              stack<libchars::command_node_*,_std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>_>
              ::empty(&this->S);
      if (bVar9) {
        return false;
      }
      ppcVar8 = std::
                stack<libchars::command_node_*,_std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>_>
                ::top(&this->S);
      local_48 = (*ppcVar8)->next;
      if (local_48 == (command_node *)0x0) break;
      std::
      stack<libchars::command_node_*,_std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>_>
      ::pop(&this->S);
      std::
      stack<libchars::command_node_*,_std::deque<libchars::command_node_*,_std::allocator<libchars::command_node_*>_>_>
      ::push(&this->S,&local_48);
      this->idx = 0;
    }
  }
  return false;
}

Assistant:

bool command_cursor::find(const std::string &search, command::filter_t mask, bool ignore_hidden)
    {
        if (search.empty())
            return false;

        size_t si = 0; // index into search (0..length)

        while (current() != NULL && si < search.length()) {
            char c = search.at(si);

            if (idx >= current_length()) {
                if (current()->head != NULL && (current()->mask & mask) != 0 && (!current()->hidden || ignore_hidden)) {
                    S.push(current()->head);
                    idx = 0;
                }
                else {
                    return false;
                }
            }
            else if (c == current_char() && (current()->mask & mask) != 0 && (!current()->hidden || ignore_hidden)) {
                ++si;
                ++idx;
                w += c;
            }
            else if (idx == 0) {
                if (S.empty()) {
                    return false;
                }
                command_node *n = S.top()->next;
                if (n != NULL) {
                    S.pop();
                    S.push(n);
                    idx = 0;
                }
                else {
                    return false;
                }
            }
            else {
                return false;
            }
        }

        return (current() != NULL && si >= search.length() && (current()->mask & mask) != 0 && (!current()->hidden || ignore_hidden));
    }